

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

void wwSetBit(word *a,size_t pos,bool_t val)

{
  word f;
  bool_t val_local;
  size_t pos_local;
  word *a_local;
  
  a[pos >> 6] = (-(long)val ^ a[pos >> 6]) & 1L << ((byte)pos & 0x3f) ^ a[pos >> 6];
  return;
}

Assistant:

void wwSetBit(word a[], size_t pos, register bool_t val)
{
	register word f;
	ASSERT(wwIsValid(a, W_OF_B(pos + 1)));
	ASSERT(val == TRUE || val == FALSE);
	f = WORD_0 - (word)val;
	a[pos / B_PER_W] ^= (f ^ a[pos / B_PER_W]) & WORD_BIT_POS(pos % B_PER_W);
	f = 0;
}